

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O3

void __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::CloneInstsToBlock
          (ReplaceDescArrayAccessUsingVarIndex *this,BasicBlock *block,
          Instruction *inst_to_skip_cloning,
          deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *insts_to_be_cloned,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *old_ids_to_new_ids)

{
  Instruction *this_00;
  IRContext *pIVar1;
  array<signed_char,_4UL> aVar2;
  uint32_t uVar3;
  Instruction *inst;
  array<signed_char,_4UL> *paVar4;
  mapped_type *ppBVar5;
  _Elt_pointer ppIVar6;
  string message;
  size_type __dnew;
  undefined1 local_a8 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_88;
  mapped_type local_80;
  _Map_pointer local_78;
  Instruction *local_70;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_68;
  IntrusiveList<spvtools::opt::Instruction> *local_60;
  _Elt_pointer local_58;
  _Elt_pointer local_50;
  spv_position_t local_48;
  
  ppIVar6 = (insts_to_be_cloned->
            super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            )._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_58 = (insts_to_be_cloned->
             super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppIVar6 != local_58) {
    local_50 = (insts_to_be_cloned->
               super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               )._M_impl.super__Deque_impl_data._M_start._M_last;
    local_78 = (insts_to_be_cloned->
               super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               )._M_impl.super__Deque_impl_data._M_start._M_node;
    local_60 = &(block->insts_).super_IntrusiveList<spvtools::opt::Instruction>;
    local_80 = block;
    local_70 = inst_to_skip_cloning;
    local_68 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)old_ids_to_new_ids;
    do {
      this_00 = *ppIVar6;
      if (this_00 != inst_to_skip_cloning) {
        inst = Instruction::Clone(this_00,(this->super_Pass).context_);
        if (this_00->has_result_id_ == true) {
          pIVar1 = (this->super_Pass).context_;
          aVar2._M_elems =
               (_Type)Module::TakeNextIdBound
                                ((pIVar1->module_)._M_t.
                                 super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                                 .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl
                                );
          if ((aVar2._M_elems == (_Type)0x0) &&
             ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
            local_48.line._0_4_ = (array<signed_char,_4UL>)0x25;
            local_48.line._4_4_ = (array<signed_char,_4UL>)0x0;
            local_a8._0_8_ = (Instruction *)(local_a8 + 0x10);
            local_a8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_a8,(ulong)&local_48);
            local_a8._16_8_ = local_48.line;
            (((Instruction *)local_a8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
            _vptr_IntrusiveNodeBase = (_func_int **)0x667265766f204449;
            (((Instruction *)local_a8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
            next_node_ = (Instruction *)0x797254202e776f6c;
            (((Instruction *)local_a8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
            previous_node_ = (Instruction *)0x676e696e6e757220;
            (((Instruction *)local_a8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
            is_sentinel_ = true;
            (((Instruction *)local_a8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
            field_0x19 = 'c';
            (((Instruction *)local_a8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
            field_0x1a = 'o';
            (((Instruction *)local_a8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
            field_0x1b = 'm';
            (((Instruction *)local_a8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
            field_0x1c = 'p';
            (((Instruction *)local_a8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
            field_0x1d = 'a';
            (((Instruction *)local_a8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
            field_0x1e = 'c';
            (((Instruction *)local_a8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
            field_0x1f = 't';
            *(undefined8 *)
             &(((Instruction *)local_a8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>)
              .field_0x1d = 0x2e7364692d746361;
            local_a8._8_8_ = local_48.line;
            *(undefined1 *)
             ((long)&(((Instruction *)local_a8._0_8_)->
                     super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase +
             local_48.line) = 0;
            local_48.line = 0;
            local_48.column = 0;
            local_48.index = 0;
            std::
            function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
            ::operator()(&pIVar1->consumer_,SPV_MSG_ERROR,"",&local_48,(char *)local_a8._0_8_);
            if ((Instruction *)local_a8._0_8_ != (Instruction *)(local_a8 + 0x10)) {
              operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
            }
            if (inst->has_result_id_ != false) {
LAB_005301ae:
              __assert_fail("res_id != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                            ,0x2cd,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
            }
LAB_005301cd:
            __assert_fail("has_result_id_",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                          ,0x2c8,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
          }
          if (inst->has_result_id_ == false) goto LAB_005301cd;
          if (aVar2._M_elems == (_Type)0x0) goto LAB_005301ae;
          local_a8._0_8_ = &PTR__SmallVector_00930a20;
          local_a8._24_8_ = local_a8 + 0x10;
          local_88._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_a8[0x10] = aVar2._M_elems[0];
          local_a8[0x11] = aVar2._M_elems[1];
          local_a8[0x12] = aVar2._M_elems[2];
          local_a8[0x13] = aVar2._M_elems[3];
          local_a8._8_4_ = (array<signed_char,_4UL>)0x1;
          local_a8._12_4_ = (array<signed_char,_4UL>)0x0;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)
                     ((long)((((inst->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_start)->words).buffer +
                            0xfffffffffffffffc) + (ulong)((uint)inst->has_type_id_ * 0x30)),
                     (SmallVector<unsigned_int,_2UL> *)local_a8);
          inst_to_skip_cloning = local_70;
          local_a8._0_8_ = &PTR__SmallVector_00930a20;
          if (local_88._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_88,local_88._M_head_impl);
          }
          uVar3 = 0;
          if (this_00->has_result_id_ == true) {
            uVar3 = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
          }
          local_a8._0_4_ = uVar3;
          paVar4 = (array<signed_char,_4UL> *)
                   std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[](local_68,(key_type *)local_a8);
          *&paVar4->_M_elems = aVar2._M_elems;
        }
        pIVar1 = (this->super_Pass).context_;
        if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(pIVar1);
        }
        analysis::DefUseManager::AnalyzeInstDefUse
                  ((pIVar1->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,inst);
        pIVar1 = (this->super_Pass).context_;
        local_a8._0_8_ = inst;
        if ((pIVar1->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
          ppBVar5 = std::__detail::
                    _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&pIVar1->instr_to_block_,(key_type *)local_a8);
          *ppBVar5 = local_80;
        }
        utils::IntrusiveList<spvtools::opt::Instruction>::push_back(local_60,inst);
      }
      ppIVar6 = ppIVar6 + 1;
      if (ppIVar6 == local_50) {
        ppIVar6 = local_78[1];
        local_78 = local_78 + 1;
        local_50 = ppIVar6 + 0x40;
      }
    } while (ppIVar6 != local_58);
  }
  return;
}

Assistant:

void ReplaceDescArrayAccessUsingVarIndex::CloneInstsToBlock(
    BasicBlock* block, Instruction* inst_to_skip_cloning,
    const std::deque<Instruction*>& insts_to_be_cloned,
    std::unordered_map<uint32_t, uint32_t>* old_ids_to_new_ids) const {
  for (auto* inst_to_be_cloned : insts_to_be_cloned) {
    if (inst_to_be_cloned == inst_to_skip_cloning) continue;
    std::unique_ptr<Instruction> clone(inst_to_be_cloned->Clone(context()));
    if (inst_to_be_cloned->HasResultId()) {
      uint32_t new_id = context()->TakeNextId();
      clone->SetResultId(new_id);
      (*old_ids_to_new_ids)[inst_to_be_cloned->result_id()] = new_id;
    }
    get_def_use_mgr()->AnalyzeInstDefUse(clone.get());
    context()->set_instr_block(clone.get(), block);
    block->AddInstruction(std::move(clone));
  }
}